

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int in_stack_00000008;
  int i_4;
  int i_3;
  float *cumulativeScaleFactors;
  int i_2;
  float sum;
  int k_2;
  int i_1;
  int k_1;
  int l;
  int i;
  int k;
  int v;
  int u;
  int scalingFactorsIndex;
  float *freqs;
  float *wt;
  float *rootPartials;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  int local_98;
  int local_94;
  int local_84;
  float local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_34;
  
  for (local_34 = 0; local_34 < in_stack_00000008; local_34 = local_34 + 1) {
    iVar1 = *(int *)(in_R9 + (long)local_34 * 4);
    local_98 = *(int *)(*(long *)(in_RDI + 0x88) + (long)iVar1 * 4);
    iVar1 = *(int *)(*(long *)(in_RDI + 0x88) + (long)(iVar1 + 1) * 4);
    lVar3 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    pfVar4 = *(float **)(*(long *)(in_RDI + 0x98) + (long)*(int *)(in_RDX + (long)local_34 * 4) * 8)
    ;
    lVar5 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_RCX + (long)local_34 * 4) * 8);
    iVar2 = *(int *)(in_R8 + (long)local_34 * 4);
    local_60 = local_98 * *(int *)(in_RDI + 0x24);
    local_64 = local_98 * *(int *)(in_RDI + 0x2c);
    for (local_68 = local_98; local_68 < iVar1; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x24); local_6c = local_6c + 1) {
        *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_60 * 4) =
             *(float *)(lVar3 + (long)local_64 * 4) * *pfVar4;
        local_60 = local_60 + 1;
        local_64 = local_64 + 1;
      }
    }
    for (local_70 = 1; local_70 < *(int *)(in_RDI + 0x34); local_70 = local_70 + 1) {
      local_60 = local_98 * *(int *)(in_RDI + 0x24);
      local_64 = ((*(int *)(in_RDI + 0x14) - iVar1) + local_98) * *(int *)(in_RDI + 0x2c) + local_64
      ;
      for (local_74 = local_98; local_74 < iVar1; local_74 = local_74 + 1) {
        for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x24); local_78 = local_78 + 1) {
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[local_70]),
                                   ZEXT416(*(uint *)(lVar3 + (long)local_64 * 4)),
                                   ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_60 * 4))
                                  );
          *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_60 * 4) = auVar7._0_4_;
          local_60 = local_60 + 1;
          local_64 = local_64 + 1;
        }
      }
    }
    local_60 = local_98 * *(int *)(in_RDI + 0x24);
    for (local_7c = local_98; local_7c < iVar1; local_7c = local_7c + 1) {
      local_80 = 0.0;
      for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x24); local_84 = local_84 + 1) {
        auVar7 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_60 * 4)),
                                 ZEXT416(*(uint *)(lVar5 + (long)local_84 * 4)),
                                 ZEXT416((uint)local_80));
        local_80 = auVar7._0_4_;
        local_60 = local_60 + 1;
      }
      dVar6 = log((double)local_80);
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_7c * 4) = (float)dVar6;
    }
    if (-1 < iVar2) {
      lVar3 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar2 * 8);
      for (local_94 = local_98; local_94 < iVar1; local_94 = local_94 + 1) {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_94 * 4) =
             *(float *)(lVar3 + (long)local_94 * 4) +
             *(float *)(*(long *)(in_RDI + 0x108) + (long)local_94 * 4);
      }
    }
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    *(undefined8 *)(_i_4 + (long)local_34 * 8) = 0;
    for (; local_98 < iVar1; local_98 = local_98 + 1) {
      auVar9._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_98 * 4);
      auVar9._8_8_ = auVar8._8_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_98 * 8);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(_i_4 + (long)local_34 * 8);
      auVar7 = vfmadd213sd_fma(auVar7,auVar9,auVar10);
      auVar8 = ZEXT1664(auVar7);
      *(long *)(_i_4 + (long)local_34 * 8) = auVar7._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}